

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O1

void __thiscall
CatmullClarkSubdivider::InternSubdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num)

{
  pointer ppVar1;
  uint uVar2;
  float fVar3;
  aiMesh *paVar4;
  uint uVar5;
  float fVar6;
  pointer puVar7;
  uint uVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  Logger *this_00;
  aiMesh *paVar11;
  ulong *puVar12;
  aiVector3D *paVar13;
  void *__s;
  aiColor4D *__s_00;
  uint *puVar14;
  mapped_type *pmVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  aiFace *paVar19;
  ulong uVar20;
  long lVar21;
  aiMesh **ppaVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  Vertex *pVVar29;
  aiFace *paVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  size_t sVar34;
  bool bVar35;
  ai_real pRadius;
  float fVar36;
  UIntVector maptbl;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  moffsets;
  UIntVector cntadjfac;
  UIntVector ofsadjvec;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> centroids;
  UIntVector faceadjac;
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  new_points;
  EdgeMap edges;
  SpatialSort spatial;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> tmp;
  uint local_ab4;
  int local_a90;
  size_type local_a88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a78;
  aiFace *local_a58;
  uint local_a4c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a48;
  aiFace *local_a30;
  ulong local_a28;
  aiMesh *local_a20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a18;
  int local_9fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9f8;
  aiMesh **local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> local_9c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_9b0;
  CatmullClarkSubdivider *local_998;
  ulong local_990;
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  local_988;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>,_std::_Select1st<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
  local_970;
  SpatialSort local_940;
  undefined1 local_918 [112];
  ios_base local_8a8 [264];
  char *local_7a0 [2];
  long local_790 [32];
  Vertex local_690;
  Vertex local_580;
  Vertex local_470;
  Vertex local_360;
  Vertex local_250;
  Vertex local_140;
  
  if ((smesh == (aiMesh **)0x0) || (out == (aiMesh **)0x0)) {
    __assert_fail("__null != smesh && __null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                  ,0xec,
                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                 );
  }
  if (num != 0) {
    local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Assimp::SpatialSort::SpatialSort(&local_940);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector(&local_a48,nmesh,(allocator_type *)local_918);
    local_a4c = num;
    local_9e0 = out;
    local_998 = this;
    if (nmesh == 0) {
      local_ab4 = 0;
    }
    else {
      sVar31 = 0;
      local_ab4 = 0;
      uVar23 = 0;
      do {
        paVar4 = smesh[sVar31];
        Assimp::SpatialSort::Append(&local_940,paVar4->mVertices,paVar4->mNumVertices,0xc,false);
        local_a48.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar31].first = local_ab4;
        local_a48.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar31].second = uVar23;
        local_ab4 = local_ab4 + paVar4->mNumFaces;
        uVar23 = uVar23 + paVar4->mNumVertices;
        sVar31 = sVar31 + 1;
      } while (nmesh != sVar31);
    }
    Assimp::SpatialSort::Finalize(&local_940);
    pRadius = Assimp::ComputePositionEpsilon(smesh,nmesh);
    uVar23 = Assimp::SpatialSort::GenerateMappingTable(&local_940,&local_a78,pRadius);
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::vector
              (&local_9c8,(ulong)local_ab4,(allocator_type *)local_918);
    local_a88 = 0;
    if (nmesh == 0) {
      local_a88 = 0;
    }
    else {
      sVar31 = 0;
      lVar21 = 0;
      do {
        paVar4 = smesh[sVar31];
        if (paVar4->mNumFaces != 0) {
          uVar18 = 0;
          do {
            paVar30 = paVar4->mFaces + uVar18;
            pVVar29 = local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar21;
            uVar8 = paVar4->mFaces[uVar18].mNumIndices;
            uVar24 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar32 = 0;
              do {
                Assimp::Vertex::Vertex((Vertex *)local_7a0,paVar4,paVar30->mIndices[uVar32]);
                Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,pVVar29,(Vertex *)local_7a0)
                ;
                memcpy(pVVar29,(Vertex *)local_918,0x110);
                uVar32 = uVar32 + 1;
                uVar24 = (ulong)paVar30->mNumIndices;
              } while (uVar32 < uVar24);
            }
            Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                      ((Vertex *)local_918,pVVar29,1.0 / (float)uVar24);
            memcpy(pVVar29,(Vertex *)local_918,0x110);
            local_a88 = (size_type)((int)local_a88 + paVar30->mNumIndices);
            uVar18 = uVar18 + 1;
            lVar21 = lVar21 + 1;
          } while (uVar18 < paVar4->mNumFaces);
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != nmesh);
    }
    local_970._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_970._M_impl.super__Rb_tree_header._M_header;
    local_970._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_970._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_970._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_970._M_impl.super__Rb_tree_header._M_header._M_right =
         local_970._M_impl.super__Rb_tree_header._M_header._M_left;
    if (nmesh != 0) {
      sVar31 = 0;
      do {
        paVar4 = smesh[sVar31];
        if (paVar4->mNumFaces != 0) {
          uVar18 = 0;
          do {
            uVar8 = paVar4->mFaces[uVar18].mNumIndices;
            uVar24 = (ulong)uVar8;
            if (uVar8 != 0) {
              paVar30 = paVar4->mFaces + uVar18;
              uVar32 = 0;
              do {
                puVar14 = paVar30->mIndices;
                uVar8 = puVar14[uVar32];
                bVar35 = uVar32 != (int)uVar24 - 1;
                uVar32 = uVar32 + 1;
                uVar24 = 0;
                if (bVar35) {
                  uVar24 = uVar32;
                }
                uVar16 = puVar14[uVar24];
                uVar17 = local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [local_a48.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar31].second + uVar8];
                uVar2 = local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [local_a48.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar31].second + uVar16];
                uVar5 = uVar2;
                if (uVar17 < uVar2) {
                  uVar5 = uVar17;
                }
                if (uVar2 < uVar17) {
                  uVar2 = uVar17;
                }
                local_918._0_8_ = CONCAT44(uVar5,uVar2);
                pmVar9 = std::
                         map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                         ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                       *)&local_970,(key_type_conflict1 *)local_918);
                uVar2 = pmVar9->ref;
                uVar17 = uVar2 + 1;
                pmVar9->ref = uVar17;
                if (uVar17 < 3) {
                  if (uVar2 == 0) {
                    Assimp::Vertex::Vertex((Vertex *)local_7a0,paVar4,uVar8);
                    Assimp::Vertex::Vertex(&local_690,paVar4,uVar16);
                    Assimp::Vertex::BinaryOp<std::plus>
                              ((Vertex *)local_918,(Vertex *)local_7a0,&local_690);
                    pVVar29 = &pmVar9->midpoint;
                    memcpy(pVVar29,(Vertex *)local_918,0x110);
                    memcpy(pmVar9,(Vertex *)local_918,0x110);
                    Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                              ((Vertex *)local_918,pVVar29,0.5);
                    memcpy(pVVar29,(Vertex *)local_918,0x110);
                  }
                  local_a90 = (int)uVar18;
                  Assimp::Vertex::BinaryOp<std::plus>
                            ((Vertex *)local_918,&pmVar9->edge_point,
                             local_9c8.
                             super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (local_a48.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar31].first + local_a90));
                  memcpy(pmVar9,(Vertex *)local_918,0x110);
                }
                uVar24 = (ulong)paVar30->mNumIndices;
              } while (uVar32 < uVar24);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < paVar4->mNumFaces);
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != nmesh);
    }
    iVar28 = 0;
    if ((_Rb_tree_header *)local_970._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_970._M_impl.super__Rb_tree_header) {
      iVar28 = 0;
      p_Var10 = local_970._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        uVar8 = *(uint *)&p_Var10[0x12]._M_parent;
        if (uVar8 < 2) {
          if (uVar8 == 0) {
            __assert_fail("(*it).second.ref",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                          ,0x150,
                          "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                         );
          }
          iVar28 = iVar28 + 1;
        }
        Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                  ((Vertex *)local_918,(Vertex *)&p_Var10[1]._M_parent,1.0 / ((float)uVar8 + 2.0));
        memcpy(&p_Var10[1]._M_parent,(Vertex *)local_918,0x110);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_970._M_impl.super__Rb_tree_header);
    }
    if (iVar28 != 0) {
      this_00 = Assimp::DefaultLogger::get();
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918,
                 (char (*) [31])"Catmull-Clark Subdivider: got ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_918);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_918," bad edges touching only one face (totally ",0x2b);
      std::ostream::_M_insert<unsigned_long>((ulong)local_918);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_918," edges). ",9);
      std::__cxx11::stringbuf::str();
      Assimp::Logger::debug(this_00,local_7a0[0]);
      if ((float *)local_7a0[0] != (float *)((long)&((Vertex *)local_7a0)->normal + 4U)) {
        operator_delete(local_7a0[0],local_790[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_918);
      std::ios_base::~ios_base(local_8a8);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_9b0,local_a88,(allocator_type *)local_918);
    local_918._0_8_ = local_918._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_a18,
               (long)local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)local_918
               ,(allocator_type *)local_7a0);
    local_918._0_8_ = local_918._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_9f8,
               ((long)local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) + 1,
               (value_type_conflict1 *)local_918,(allocator_type *)local_7a0);
    if (nmesh != 0) {
      sVar31 = 0;
      do {
        paVar4 = smesh[sVar31];
        if (paVar4->mNumFaces != 0) {
          uVar18 = 0;
          do {
            if (paVar4->mFaces[uVar18].mNumIndices != 0) {
              paVar30 = paVar4->mFaces + uVar18;
              uVar24 = 0;
              do {
                local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [paVar30->mIndices[uVar24] +
                  local_a48.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar31].second]] =
                     local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [paVar30->mIndices[uVar24] +
                       local_a48.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar31].second]] + 1;
                uVar24 = uVar24 + 1;
              } while (uVar24 < paVar30->mNumIndices);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < paVar4->mNumFaces);
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != nmesh);
    }
    if (local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar8 = 0;
      uVar18 = 0;
      do {
        local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18 + 1] = uVar8;
        uVar8 = uVar8 + local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)local_a18.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a18.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
    if (nmesh != 0) {
      sVar31 = 0;
      do {
        paVar4 = smesh[sVar31];
        if (paVar4->mNumFaces != 0) {
          uVar18 = 0;
          do {
            if (paVar4->mFaces[uVar18].mNumIndices != 0) {
              paVar30 = paVar4->mFaces + uVar18;
              uVar24 = 0;
              do {
                uVar8 = local_a48.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar31].first;
                uVar16 = local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [paVar30->mIndices[uVar24] +
                           local_a48.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar31].second] + 1];
                local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [paVar30->mIndices[uVar24] +
                  local_a48.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar31].second] + 1] = uVar16 + 1;
                local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] = uVar8 + (int)uVar18;
                uVar24 = uVar24 + 1;
              } while (uVar24 < paVar30->mNumIndices);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < paVar4->mNumFaces);
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != nmesh);
    }
    lVar21 = (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2;
    if (lVar21 != 1) {
      lVar25 = 0;
      do {
        if ((ulong)local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar25] != 0) {
          uVar18 = 0;
          do {
            uVar8 = local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar25] + (int)uVar18];
            if (local_ab4 <= uVar8) {
              __assert_fail("fidx < totfaces",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                            ,0x185,
                            "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                           );
            }
            if (1 < nmesh) {
              lVar26 = 0;
              while (local_a48.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar26 + 1].first <= uVar8) {
                lVar26 = lVar26 + 1;
                if (nmesh - 1 == lVar26) goto LAB_00699682;
              }
              uVar8 = uVar8 - local_a48.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar26].first;
              uVar16 = smesh[lVar26]->mFaces[uVar8].mNumIndices;
              if (uVar16 == 0) goto LAB_0069a341;
              lVar27 = 0;
              while (local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [smesh[lVar26]->mFaces[uVar8].mIndices[lVar27] +
                      local_a48.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar26].second] != (uint)lVar25) {
                lVar27 = lVar27 + 1;
                if (uVar16 == (uint)lVar27) {
LAB_0069a341:
                  __assert_fail("haveit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                                ,0x193,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
              }
            }
LAB_00699682:
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_a18.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar25]);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != lVar21 + -1);
    }
    local_918._0_8_ = local_918._0_8_ & 0xffffffffffffff00;
    memset(local_918 + 4,0,0x110);
    std::vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ::vector(&local_988,(ulong)uVar23,(value_type *)local_918,(allocator_type *)local_7a0);
    if (nmesh != 0) {
      sVar31 = 0;
      do {
        paVar4 = smesh[sVar31];
        paVar11 = (aiMesh *)operator_new(0x520);
        paVar11->mPrimitiveTypes = 0;
        paVar11->mNumVertices = 0;
        paVar11->mNumFaces = 0;
        memset(&paVar11->mVertices,0,0xcc);
        paVar11->mBones = (aiBone **)0x0;
        paVar11->mMaterialIndex = 0;
        (paVar11->mName).length = 0;
        (paVar11->mName).data[0] = '\0';
        memset((paVar11->mName).data + 1,0x1b,0x3ff);
        paVar11->mNumAnimMeshes = 0;
        paVar11->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar11->mMethod = 0;
        (paVar11->mAABB).mMin.x = 0.0;
        (paVar11->mAABB).mMin.y = 0.0;
        (paVar11->mAABB).mMin.z = 0.0;
        (paVar11->mAABB).mMax.x = 0.0;
        (paVar11->mAABB).mMax.y = 0.0;
        (paVar11->mAABB).mMax.z = 0.0;
        paVar11->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar11->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar11->mNumUVComponents[0] = 0;
        paVar11->mNumUVComponents[1] = 0;
        paVar11->mNumUVComponents[2] = 0;
        paVar11->mNumUVComponents[3] = 0;
        paVar11->mNumUVComponents[4] = 0;
        paVar11->mNumUVComponents[5] = 0;
        paVar11->mNumUVComponents[6] = 0;
        paVar11->mNumUVComponents[7] = 0;
        paVar11->mColors[0] = (aiColor4D *)0x0;
        paVar11->mColors[1] = (aiColor4D *)0x0;
        paVar11->mColors[2] = (aiColor4D *)0x0;
        paVar11->mColors[3] = (aiColor4D *)0x0;
        paVar11->mColors[4] = (aiColor4D *)0x0;
        paVar11->mColors[5] = (aiColor4D *)0x0;
        paVar11->mColors[6] = (aiColor4D *)0x0;
        paVar11->mColors[7] = (aiColor4D *)0x0;
        local_9e0[sVar31] = paVar11;
        if (paVar4->mNumFaces != 0) {
          lVar21 = 0;
          uVar18 = 0;
          do {
            paVar11->mNumFaces =
                 paVar11->mNumFaces + *(int *)((long)&paVar4->mFaces->mNumIndices + lVar21);
            uVar18 = uVar18 + 1;
            lVar21 = lVar21 + 0x10;
          } while (uVar18 < paVar4->mNumFaces);
        }
        uVar23 = paVar11->mNumFaces;
        uVar18 = (ulong)uVar23;
        puVar12 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
        *puVar12 = uVar18;
        paVar30 = (aiFace *)(puVar12 + 1);
        if (uVar18 != 0) {
          paVar19 = paVar30;
          do {
            paVar19->mNumIndices = 0;
            paVar19->mIndices = (uint *)0x0;
            paVar19 = paVar19 + 1;
          } while (paVar19 != paVar30 + uVar18);
        }
        paVar11->mFaces = paVar30;
        uVar18 = (ulong)(uVar23 << 2);
        paVar11->mNumVertices = uVar23 << 2;
        paVar13 = (aiVector3D *)operator_new__(uVar18 * 0xc);
        if (uVar18 != 0) {
          memset(paVar13,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar11->mVertices = paVar13;
        paVar11->mPrimitiveTypes = 8;
        paVar11->mMaterialIndex = paVar4->mMaterialIndex;
        if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
          paVar13 = (aiVector3D *)operator_new__(uVar18 * 0xc);
          if ((uVar23 & 0x3fffffff) != 0) {
            memset(paVar13,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mNormals = paVar13;
        }
        if (((paVar4->mTangents != (aiVector3D *)0x0) && (paVar4->mBitangents != (aiVector3D *)0x0))
           && (paVar4->mNumVertices != 0)) {
          uVar23 = paVar11->mNumVertices;
          uVar18 = (ulong)uVar23;
          paVar13 = (aiVector3D *)operator_new__(uVar18 * 0xc);
          if (uVar18 != 0) {
            memset(paVar13,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mTangents = paVar13;
          paVar13 = (aiVector3D *)operator_new__(uVar18 * 0xc);
          if (uVar23 != 0) {
            memset(paVar13,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar11->mBitangents = paVar13;
        }
        lVar21 = 0;
        local_a20 = paVar11;
        do {
          if ((*(long *)((long)paVar4->mTextureCoords + lVar21 * 2) == 0) ||
             (paVar4->mNumVertices == 0)) break;
          uVar18 = (ulong)local_a20->mNumVertices;
          __s = operator_new__(uVar18 * 0xc);
          if (uVar18 != 0) {
            memset(__s,0,((uVar18 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)((long)paVar11->mTextureCoords + lVar21 * 2) = __s;
          *(undefined4 *)((long)paVar11->mNumUVComponents + lVar21) =
               *(undefined4 *)((long)paVar4->mNumUVComponents + lVar21);
          lVar21 = lVar21 + 4;
        } while (lVar21 != 0x20);
        paVar11 = local_a20;
        lVar21 = 6;
        do {
          if ((paVar4->mColors[lVar21 + -6] == (aiColor4D *)0x0) || (paVar4->mNumVertices == 0))
          break;
          uVar23 = paVar11->mNumVertices;
          uVar18 = (ulong)uVar23 << 4;
          __s_00 = (aiColor4D *)operator_new__(uVar18);
          if ((ulong)uVar23 != 0) {
            memset(__s_00,0,uVar18);
          }
          paVar11->mColors[lVar21 + -6] = __s_00;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0xe);
        paVar11->mNumVertices = paVar11->mNumFaces << 2;
        if (paVar4->mNumFaces != 0) {
          uVar18 = 0;
          uVar24 = 0;
          uVar32 = 0;
          do {
            local_9d8 = uVar18;
            if (paVar4->mFaces[uVar18].mNumIndices != 0) {
              local_a58 = paVar4->mFaces + uVar18;
              uVar18 = 0;
              do {
                paVar30 = paVar11->mFaces;
                local_9fc = (int)uVar24;
                paVar30[uVar24].mNumIndices = 4;
                local_a28 = uVar32;
                puVar14 = (uint *)operator_new__(0x10);
                local_a30 = paVar30 + uVar24;
                local_a30->mIndices = puVar14;
                uVar23 = local_a48.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar31].first;
                *puVar14 = (uint)local_a28;
                Assimp::Vertex::SortBack
                          (local_9c8.
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_start + (uVar23 + (int)local_9d8),
                           paVar11,(uint)local_a28);
                paVar30 = local_a58;
                local_990 = uVar18 + 1;
                uVar24 = 0;
                if (uVar18 != local_a58->mNumIndices - 1) {
                  uVar24 = local_990 & 0xffffffff;
                }
                fVar36 = (float)local_a78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [local_a58->mIndices[uVar18] +
                                 local_a48.
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar31].second];
                fVar3 = (float)local_a78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_a48.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[sVar31].second +
                                local_a58->mIndices[uVar24]];
                fVar6 = fVar3;
                if ((uint)fVar36 < (uint)fVar3) {
                  fVar6 = fVar36;
                }
                if ((uint)fVar3 < (uint)fVar36) {
                  fVar3 = fVar36;
                }
                local_918._0_8_ = CONCAT44(fVar6,fVar3);
                pmVar9 = std::
                         map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                         ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                       *)&local_970,(key_type_conflict1 *)local_918);
                uVar23 = (uint)uVar18;
                if (uVar18 == 0) {
                  uVar23 = paVar30->mNumIndices;
                }
                puVar14 = paVar30->mIndices;
                uVar8 = local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [puVar14[uVar18] +
                         local_a48.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar31].second];
                uVar23 = local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [local_a48.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar31].second +
                          puVar14[uVar23 - 1]];
                uVar16 = uVar23;
                if (uVar8 < uVar23) {
                  uVar16 = uVar8;
                }
                if (uVar23 < uVar8) {
                  uVar23 = uVar8;
                }
                local_918._0_8_ = CONCAT44(uVar16,uVar23);
                pmVar15 = std::
                          map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                          ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                        *)&local_970,(key_type_conflict1 *)local_918);
                paVar11 = local_a20;
                paVar19 = local_a30;
                iVar28 = (int)local_a28;
                local_a30->mIndices[3] = iVar28 + 1U;
                local_9d0 = uVar18;
                Assimp::Vertex::SortBack(&pmVar9->edge_point,local_a20,iVar28 + 1U);
                paVar30 = local_a58;
                paVar19->mIndices[1] = iVar28 + 2U;
                Assimp::Vertex::SortBack(&pmVar15->edge_point,paVar11,iVar28 + 2U);
                puVar7 = local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar19 = local_a58;
                uVar23 = local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [paVar30->mIndices[local_9d0] +
                          local_a48.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar31].second];
                uVar18 = (ulong)uVar23;
                ppVar1 = local_988.
                         super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18;
                if (local_988.
                    super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar18].first == false) {
                  ppVar1->first = true;
                  uVar24 = (ulong)local_a18.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar18];
                  if (uVar24 < 3) {
                    Assimp::Vertex::Vertex
                              ((Vertex *)local_918,paVar4,local_a58->mIndices[local_9d0]);
                    memcpy(&ppVar1->second,(Vertex *)local_918,0x110);
                    iVar28 = (int)local_a28;
                    paVar30 = paVar19;
                  }
                  else {
                    uVar8 = local_9f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar18];
                    memset((Vertex *)local_7a0,0,0x110);
                    memset(&local_690,0,0x110);
                    uVar32 = 0;
                    do {
                      uVar16 = puVar7[uVar8 + uVar32];
                      if (local_ab4 <= uVar16) {
                        __assert_fail("adj[o] < totfaces",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                                      ,0x202,
                                      "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                     );
                      }
                      Assimp::Vertex::BinaryOp<std::plus>
                                ((Vertex *)local_918,(Vertex *)local_7a0,
                                 local_9c8.
                                 super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar16);
                      memcpy((Vertex *)local_7a0,(Vertex *)local_918,0x110);
                      uVar16 = puVar7[uVar8 + uVar32];
                      if (uVar16 < (local_a48.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first) {
                        uVar33 = 0;
                        ppaVar22 = smesh;
LAB_00699e8d:
                        paVar11 = *ppaVar22;
                      }
                      else {
                        uVar33 = 1;
                        do {
                          sVar34 = nmesh;
                          if ((nmesh == uVar33) ||
                             (sVar34 = uVar33,
                             uVar16 < local_a48.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar33].first)) {
                            ppaVar22 = smesh + (sVar34 - 1);
                            uVar33 = sVar34 - 1;
                            goto LAB_00699e8d;
                          }
                          uVar33 = uVar33 + 1;
                        } while (uVar33 <= nmesh);
                        paVar11 = (aiMesh *)0x0;
                      }
                      uVar16 = uVar16 - local_a48.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar33].first;
                      if (paVar11->mNumFaces <= uVar16) {
                        __assert_fail("adj[o]-moffsets[nidx].first < mp->mNumFaces",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                                      ,0x215,
                                      "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                     );
                      }
                      uVar17 = paVar11->mFaces[uVar16].mNumIndices;
                      if (uVar17 == 0) {
LAB_0069a2e4:
                        __assert_fail("haveit",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Subdivision.cpp"
                                      ,0x232,
                                      "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                                     );
                      }
                      paVar30 = paVar11->mFaces + uVar16;
                      lVar21 = 0;
                      while (local_a78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start
                             [paVar30->mIndices[lVar21] +
                              local_a48.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar33].second] != uVar23) {
                        lVar21 = lVar21 + 1;
                        if (uVar17 == (uint)lVar21) goto LAB_0069a2e4;
                      }
                      uVar16 = (uint)lVar21;
                      if (uVar16 != 0) {
                        uVar17 = uVar16;
                      }
                      uVar17 = local_a78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_a48.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar33].second +
                                paVar30->mIndices[uVar17 - 1]];
                      uVar20 = (ulong)uVar17;
                      if (uVar23 < uVar17) {
                        uVar20 = uVar18;
                      }
                      if (uVar17 < uVar23) {
                        uVar17 = uVar23;
                      }
                      local_918._0_8_ = uVar20 << 0x20 | (ulong)uVar17;
                      pmVar9 = std::
                               map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                               ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                             *)&local_970,(key_type_conflict1 *)local_918);
                      uVar17 = uVar16 + 1;
                      if (uVar16 - paVar30->mNumIndices == -1) {
                        uVar17 = 0;
                      }
                      uVar16 = local_a78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [paVar30->mIndices[uVar17] +
                                local_a48.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar33].second];
                      uVar17 = uVar16;
                      if (uVar23 < uVar16) {
                        uVar17 = uVar23;
                      }
                      uVar33 = (ulong)uVar16;
                      if (uVar16 < uVar23) {
                        uVar33 = uVar18;
                      }
                      local_918._0_8_ = (ulong)uVar17 << 0x20 | uVar33;
                      pmVar15 = std::
                                map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                              *)&local_970,(key_type_conflict1 *)local_918);
                      Assimp::Vertex::BinaryOp<std::plus>
                                (&local_580,&pmVar9->midpoint,&pmVar15->midpoint);
                      Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,&local_690,&local_580)
                      ;
                      memcpy(&local_690,(Vertex *)local_918,0x110);
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != uVar24);
                    Assimp::Vertex::Vertex(&local_140,paVar4,local_a58->mIndices[local_9d0]);
                    fVar36 = (float)uVar24;
                    Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                              (&local_470,&local_140,(fVar36 + -3.0) / fVar36);
                    fVar36 = 1.0 / (fVar36 * fVar36);
                    Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                              (&local_250,&local_690,fVar36);
                    Assimp::Vertex::BinaryOp<std::plus>(&local_580,&local_470,&local_250);
                    Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                              (&local_360,(Vertex *)local_7a0,fVar36);
                    Assimp::Vertex::BinaryOp<std::plus>((Vertex *)local_918,&local_580,&local_360);
                    memcpy(&ppVar1->second,(Vertex *)local_918,0x110);
                    iVar28 = (int)local_a28;
                    paVar30 = local_a58;
                  }
                }
                paVar11 = local_a20;
                uVar23 = local_9fc + 1;
                uVar32 = (ulong)(iVar28 + 4);
                local_a30->mIndices[2] = iVar28 + 3U;
                Assimp::Vertex::SortBack(&ppVar1->second,local_a20,iVar28 + 3U);
                uVar24 = (ulong)uVar23;
                uVar18 = local_990;
              } while (local_990 < paVar30->mNumIndices);
            }
            uVar18 = local_9d8 + 1;
          } while (uVar18 < paVar4->mNumFaces);
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != nmesh);
    }
    if (local_988.
        super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_988.
                      super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_988.
                            super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_988.
                            super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_9f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_9f8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ppaVar22 = local_9e0;
    if (local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a18.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a18.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a18.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_9b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_9b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>,_std::_Select1st<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
    ::~_Rb_tree(&local_970);
    if (local_a4c != 1) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_918,nmesh,
                 (allocator_type *)local_7a0);
      InternSubdivide(local_998,ppaVar22,nmesh,(aiMesh **)local_918._0_8_,local_a4c - 1);
      if (nmesh != 0) {
        sVar31 = 0;
        do {
          paVar4 = ppaVar22[sVar31];
          if (paVar4 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(paVar4);
            operator_delete(paVar4,0x520);
          }
          ppaVar22[sVar31] = *(aiMesh **)(local_918._0_8_ + sVar31 * 8);
          sVar31 = sVar31 + 1;
        } while (nmesh != sVar31);
      }
      if ((aiMesh **)local_918._0_8_ != (aiMesh **)0x0) {
        operator_delete((void *)local_918._0_8_,local_918._16_8_ - local_918._0_8_);
      }
    }
    if (local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_9c8.
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_9c8.
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a48.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a48.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a48.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a48.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Assimp::SpatialSort::~SpatialSort(&local_940);
    if (local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a78.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a78.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void CatmullClarkSubdivider::InternSubdivide (
    const aiMesh* const * smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num
    )
{
    ai_assert(NULL != smesh && NULL != out);
    INIT_EDGE_HASH_TEMPORARIES();

    // no subdivision requested or end of recursive refinement
    if (!num) {
        return;
    }

    UIntVector maptbl;
    SpatialSort spatial;

    // ---------------------------------------------------------------------
    // 0. Offset table to index all meshes continuously, generate a spatially
    // sorted representation of all vertices in all meshes.
    // ---------------------------------------------------------------------
    typedef std::pair<unsigned int,unsigned int> IntPair;
    std::vector<IntPair> moffsets(nmesh);
    unsigned int totfaces = 0, totvert = 0;
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        spatial.Append(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D),false);
        moffsets[t] = IntPair(totfaces,totvert);

        totfaces += mesh->mNumFaces;
        totvert  += mesh->mNumVertices;
    }

    spatial.Finalize();
    const unsigned int num_unique = spatial.GenerateMappingTable(maptbl,ComputePositionEpsilon(smesh,nmesh));


#define FLATTEN_VERTEX_IDX(mesh_idx, vert_idx) (moffsets[mesh_idx].second+vert_idx)
#define   FLATTEN_FACE_IDX(mesh_idx, face_idx) (moffsets[mesh_idx].first+face_idx)

    // ---------------------------------------------------------------------
    // 1. Compute the centroid point for all faces
    // ---------------------------------------------------------------------
    std::vector<Vertex> centroids(totfaces);
    unsigned int nfacesout = 0;
    for (size_t t = 0, n = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i,++n)
        {
            const aiFace& face = mesh->mFaces[i];
            Vertex& c = centroids[n];

            for (unsigned int a = 0; a < face.mNumIndices;++a) {
                c += Vertex(mesh,face.mIndices[a]);
            }

            c /= static_cast<float>(face.mNumIndices);
            nfacesout += face.mNumIndices;
        }
    }

    {
    // we want edges to go away before the recursive calls so begin a new scope
    EdgeMap edges;

    // ---------------------------------------------------------------------
    // 2. Set each edge point to be the average of all neighbouring
    // face points and original points. Every edge exists twice
    // if there is a neighboring face.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        for (unsigned int i = 0; i < mesh->mNumFaces;++i)   {
            const aiFace& face = mesh->mFaces[i];

            for (unsigned int p =0; p< face.mNumIndices; ++p) {
                const unsigned int id[] = {
                    face.mIndices[p],
                    face.mIndices[p==face.mNumIndices-1?0:p+1]
                };
                const unsigned int mp[] = {
                    maptbl[FLATTEN_VERTEX_IDX(t,id[0])],
                    maptbl[FLATTEN_VERTEX_IDX(t,id[1])]
                };

                Edge& e = edges[MAKE_EDGE_HASH(mp[0],mp[1])];
                e.ref++;
                if (e.ref<=2) {
                    if (e.ref==1) { // original points (end points) - add only once
                        e.edge_point = e.midpoint = Vertex(mesh,id[0])+Vertex(mesh,id[1]);
                        e.midpoint *= 0.5f;
                    }
                    e.edge_point += centroids[FLATTEN_FACE_IDX(t,i)];
                }
            }
        }
    }

    // ---------------------------------------------------------------------
    // 3. Normalize edge points
    // ---------------------------------------------------------------------
    {unsigned int bad_cnt = 0;
    for (EdgeMap::iterator it = edges.begin(); it != edges.end(); ++it) {
        if ((*it).second.ref < 2) {
            ai_assert((*it).second.ref);
            ++bad_cnt;
        }
        (*it).second.edge_point *= 1.f/((*it).second.ref+2.f);
    }

    if (bad_cnt) {
        // Report the number of bad edges. bad edges are referenced by less than two
        // faces in the mesh. They occur at outer model boundaries in non-closed
        // shapes.
        ASSIMP_LOG_DEBUG_F("Catmull-Clark Subdivider: got ", bad_cnt, " bad edges touching only one face (totally ", 
            static_cast<unsigned int>(edges.size()), " edges). ");
    }}

    // ---------------------------------------------------------------------
    // 4. Compute a vertex-face adjacency table. We can't reuse the code
    // from VertexTriangleAdjacency because we need the table for multiple
    // meshes and out vertex indices need to be mapped to distinct values
    // first.
    // ---------------------------------------------------------------------
    UIntVector faceadjac(nfacesout), cntadjfac(maptbl.size(),0), ofsadjvec(maptbl.size()+1,0); {
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                ++cntadjfac[maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]];
            }
        }
    }
    unsigned int cur = 0;
    for (size_t i = 0; i < cntadjfac.size(); ++i) {
        ofsadjvec[i+1] = cur;
        cur += cntadjfac[i];
    }
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                faceadjac[ofsadjvec[1+maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]]++] = FLATTEN_FACE_IDX(t,i);
            }
        }
    }

    // check the other way round for consistency
#ifdef ASSIMP_BUILD_DEBUG

    for (size_t t = 0; t < ofsadjvec.size()-1; ++t) {
        for (unsigned int m = 0; m <  cntadjfac[t]; ++m) {
            const unsigned int fidx = faceadjac[ofsadjvec[t]+m];
            ai_assert(fidx < totfaces);
            for (size_t n = 1; n < nmesh; ++n) {

                if (moffsets[n].first > fidx) {
                    const aiMesh* msh = smesh[--n];
                    const aiFace& f = msh->mFaces[fidx-moffsets[n].first];

                    bool haveit = false;
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        if (maptbl[FLATTEN_VERTEX_IDX(n,f.mIndices[i])]==(unsigned int)t) {
                            haveit = true;
                            break;
                        }
                    }
                    ai_assert(haveit);
                    if (!haveit) {
                        ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Index not used");
                    }
                    break;
                }
            }
        }
    }

#endif
    }

#define GET_ADJACENT_FACES_AND_CNT(vidx,fstartout,numout) \
    fstartout = &faceadjac[ofsadjvec[vidx]], numout = cntadjfac[vidx]

    typedef std::pair<bool,Vertex> TouchedOVertex;
    std::vector<TouchedOVertex > new_points(num_unique,TouchedOVertex(false,Vertex()));
    // ---------------------------------------------------------------------
    // 5. Spawn a quad from each face point to the corresponding edge points
    // the original points being the fourth quad points.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        aiMesh* const mout = out[t] = new aiMesh();

        for (unsigned int a  = 0; a < minp->mNumFaces; ++a) {
            mout->mNumFaces += minp->mFaces[a].mNumIndices;
        }

        // We need random access to the old face buffer, so reuse is not possible.
        mout->mFaces = new aiFace[mout->mNumFaces];

        mout->mNumVertices = mout->mNumFaces*4;
        mout->mVertices = new aiVector3D[mout->mNumVertices];

        // quads only, keep material index
        mout->mPrimitiveTypes = aiPrimitiveType_POLYGON;
        mout->mMaterialIndex = minp->mMaterialIndex;

        if (minp->HasNormals()) {
            mout->mNormals = new aiVector3D[mout->mNumVertices];
        }

        if (minp->HasTangentsAndBitangents()) {
            mout->mTangents = new aiVector3D[mout->mNumVertices];
            mout->mBitangents = new aiVector3D[mout->mNumVertices];
        }

        for(unsigned int i = 0; minp->HasTextureCoords(i); ++i) {
            mout->mTextureCoords[i] = new aiVector3D[mout->mNumVertices];
            mout->mNumUVComponents[i] = minp->mNumUVComponents[i];
        }

        for(unsigned int i = 0; minp->HasVertexColors(i); ++i) {
            mout->mColors[i] = new aiColor4D[mout->mNumVertices];
        }

        mout->mNumVertices = mout->mNumFaces<<2u;
        for (unsigned int i = 0, v = 0, n = 0; i < minp->mNumFaces;++i) {

            const aiFace& face = minp->mFaces[i];
            for (unsigned int a = 0; a < face.mNumIndices;++a)  {

                // Get a clean new face.
                aiFace& faceOut = mout->mFaces[n++];
                faceOut.mIndices = new unsigned int [faceOut.mNumIndices = 4];

                // Spawn a new quadrilateral (ccw winding) for this original point between:
                // a) face centroid
                centroids[FLATTEN_FACE_IDX(t,i)].SortBack(mout,faceOut.mIndices[0]=v++);

                // b) adjacent edge on the left, seen from the centroid
                const Edge& e0 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a==face.mNumIndices-1?0:a+1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                // c) adjacent edge on the right, seen from the centroid
                const Edge& e1 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[!a?face.mNumIndices-1:a-1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                e0.edge_point.SortBack(mout,faceOut.mIndices[3]=v++);
                e1.edge_point.SortBack(mout,faceOut.mIndices[1]=v++);

                // d= original point P with distinct index i
                // F := 0
                // R := 0
                // n := 0
                // for each face f containing i
                //    F := F+ centroid of f
                //    R := R+ midpoint of edge of f from i to i+1
                //    n := n+1
                //
                // (F+2R+(n-3)P)/n
                const unsigned int org = maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])];
                TouchedOVertex& ov = new_points[org];

                if (!ov.first) {
                    ov.first = true;

                    const unsigned int* adj; unsigned int cnt;
                    GET_ADJACENT_FACES_AND_CNT(org,adj,cnt);

                    if (cnt < 3) {
                        ov.second = Vertex(minp,face.mIndices[a]);
                    }
                    else {

                        Vertex F,R;
                        for (unsigned int o = 0; o < cnt; ++o) {
                            ai_assert(adj[o] < totfaces);
                            F += centroids[adj[o]];

                            // adj[0] is a global face index - search the face in the mesh list
                            const aiMesh* mp = NULL;
                            size_t nidx;

                            if (adj[o] < moffsets[0].first) {
                                mp = smesh[nidx=0];
                            }
                            else {
                                for (nidx = 1; nidx<= nmesh; ++nidx) {
                                    if (nidx == nmesh ||moffsets[nidx].first > adj[o]) {
                                        mp = smesh[--nidx];
                                        break;
                                    }
                                }
                            }

                            ai_assert(adj[o]-moffsets[nidx].first < mp->mNumFaces);
                            const aiFace& f = mp->mFaces[adj[o]-moffsets[nidx].first];
                            bool haveit = false;

                            // find our original point in the face
                            for (unsigned int m = 0; m < f.mNumIndices; ++m) {
                                if (maptbl[FLATTEN_VERTEX_IDX(nidx,f.mIndices[m])] == org) {

                                    // add *both* edges. this way, we can be sure that we add
                                    // *all* adjacent edges to R. In a closed shape, every
                                    // edge is added twice - so we simply leave out the
                                    // factor 2.f in the amove formula and get the right
                                    // result.

                                    const Edge& c0 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[!m?f.mNumIndices-1:m-1])])];
                                    // fixme: replace with mod face.mNumIndices?

                                    const Edge& c1 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[m==f.mNumIndices-1?0:m+1])])];
                                    // fixme: replace with mod face.mNumIndices?
                                    R += c0.midpoint+c1.midpoint;

                                    haveit = true;
                                    break;
                                }
                            }

                            // this invariant *must* hold if the vertex-to-face adjacency table is valid
                            ai_assert(haveit);
                            if ( !haveit ) {
                                ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
                            }
                        }

                        const float div = static_cast<float>(cnt), divsq = 1.f/(div*div);
                        ov.second = Vertex(minp,face.mIndices[a])*((div-3.f) / div) + R*divsq + F*divsq;
                    }
                }
                ov.second.SortBack(mout,faceOut.mIndices[2]=v++);
            }
        }
    }
    }  // end of scope for edges, freeing its memory

    // ---------------------------------------------------------------------
    // 7. Apply the next subdivision step.
    // ---------------------------------------------------------------------
    if (num != 1) {
        std::vector<aiMesh*> tmp(nmesh);
        InternSubdivide (out,nmesh,&tmp.front(),num-1);
        for (size_t i = 0; i < nmesh; ++i) {
            delete out[i];
            out[i] = tmp[i];
        }
    }
}